

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLCellLinOp::compGrad
          (MLCellLinOp *this,int amrlev,Array<MultiFab_*,_3> *grad,MultiFab *sol,Location param_4)

{
  Array<MultiFab_*,_3> *pAVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long local_268;
  long local_260;
  long local_258;
  Array4<double> local_210;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  Array<MultiFab_*,_3> *local_1b8;
  long local_1b0;
  Box local_1a4;
  Box local_188;
  Box local_16c;
  Array4<double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  local_1b8 = grad;
  if (1 < (sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp) {
    Abort_host("MLCellLinOp::compGrad called, but only works for single-component solves");
  }
  (*(this->super_MLLinOp)._vptr_MLLinOp[0x47])
            (this,amrlev,0,sol,1,0,
             (tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>)
             (this->m_bndry_sol).
             super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
             super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,0);
  uVar2 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  lVar3 = *(long *)&(this->super_MLLinOp).m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_1c0 = *(double *)(lVar3 + 0x38);
  local_1c8 = *(double *)(lVar3 + 0x40);
  local_1d0 = *(double *)(lVar3 + 0x48);
  MFIter::MFIter(&mfi,(FabArrayBase *)sol,true);
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar14 = (ulong)uVar2;
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::nodaltilebox(&local_16c,&mfi,0);
    MFIter::nodaltilebox(&local_188,&mfi,1);
    MFIter::nodaltilebox(&local_1a4,&mfi,2);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_210,&sol->super_FabArray<amrex::FArrayBox>,&mfi);
    pAVar1 = local_1b8;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_d0,&local_1b8->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_110,&pAVar1->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_150,&pAVar1->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&mfi);
    lVar3 = (long)local_16c.smallend.vect[1];
    local_1b0 = (long)local_16c.smallend.vect[2];
    local_268 = 0;
    uVar4 = 0;
    while( true ) {
      lVar5 = local_1b0;
      if (uVar4 == uVar14) break;
      for (; (int)lVar5 <= local_16c.bigend.vect[2]; lVar5 = lVar5 + 1) {
        lVar11 = (long)local_d0.p +
                 local_d0.nstride * local_268 +
                 (lVar3 - local_d0.begin.y) * local_d0.jstride * 8 +
                 (lVar5 - local_d0.begin.z) * local_d0.kstride * 8 + (long)local_d0.begin.x * -8 +
                 (long)local_16c.smallend.vect[0] * 8;
        lVar6 = (long)local_210.p +
                local_210.nstride * local_268 +
                (lVar3 - local_210.begin.y) * local_210.jstride * 8 +
                (lVar5 - local_210.begin.z) * local_210.kstride * 8 + (long)local_210.begin.x * -8 +
                (long)local_16c.smallend.vect[0] * 8;
        for (lVar8 = lVar3; lVar8 <= local_16c.bigend.vect[1]; lVar8 = lVar8 + 1) {
          if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
            lVar7 = 0;
            do {
              *(double *)(lVar11 + lVar7 * 8) =
                   (*(double *)(lVar6 + lVar7 * 8) -
                   local_210.p
                   [((long)(int)lVar5 - (long)local_210.begin.z) * local_210.kstride +
                    local_210.nstride * uVar4 +
                    (lVar8 - local_210.begin.y) * local_210.jstride +
                    (long)((int)lVar7 + ((local_16c.smallend.vect[0] + -1) - local_210.begin.x))]) *
                   local_1c0;
              lVar7 = lVar7 + 1;
            } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 != (int)lVar7);
          }
          lVar11 = lVar11 + local_d0.jstride * 8;
          lVar6 = lVar6 + local_210.jstride * 8;
        }
      }
      uVar4 = uVar4 + 1;
      local_268 = local_268 + 8;
    }
    lVar3 = (long)local_188.smallend.vect[1];
    lVar5 = (long)local_188.smallend.vect[0] * 8;
    local_258 = 0;
    uVar4 = 0;
    while( true ) {
      lVar8 = (long)local_188.smallend.vect[2];
      if (uVar4 == uVar14) break;
      for (; (int)lVar8 <= local_188.bigend.vect[2]; lVar8 = lVar8 + 1) {
        lVar12 = (long)local_110.p +
                 local_110.nstride * local_258 +
                 (lVar3 - local_110.begin.y) * local_110.jstride * 8 +
                 (lVar8 - local_110.begin.z) * local_110.kstride * 8 + (long)local_110.begin.x * -8
                 + lVar5;
        lVar13 = local_210.jstride * 8;
        lVar11 = local_210.nstride * local_258 + (lVar8 - local_210.begin.z) * local_210.kstride * 8
        ;
        lVar7 = (long)local_210.p +
                (lVar3 - local_210.begin.y) * lVar13 + lVar11 + (long)local_210.begin.x * -8 + lVar5
        ;
        iVar10 = (local_188.smallend.vect[1] + -1) - local_210.begin.y;
        for (lVar6 = lVar3; lVar6 <= local_188.bigend.vect[1]; lVar6 = lVar6 + 1) {
          if (local_188.smallend.vect[0] <= local_188.bigend.vect[0]) {
            lVar9 = 0;
            do {
              *(double *)(lVar12 + lVar9 * 8) =
                   (*(double *)(lVar7 + lVar9 * 8) -
                   *(double *)
                    ((long)local_210.p +
                    lVar9 * 8 + iVar10 * lVar13 + lVar11 + (long)local_210.begin.x * -8 + lVar5)) *
                   local_1c8;
              lVar9 = lVar9 + 1;
            } while ((local_188.bigend.vect[0] - local_188.smallend.vect[0]) + 1 != (int)lVar9);
          }
          lVar12 = lVar12 + local_110.jstride * 8;
          lVar7 = lVar7 + lVar13;
          iVar10 = iVar10 + 1;
        }
      }
      uVar4 = uVar4 + 1;
      local_258 = local_258 + 8;
    }
    lVar3 = (long)local_1a4.smallend.vect[1];
    lVar5 = (long)local_1a4.smallend.vect[0] * 8;
    local_260 = 0;
    uVar4 = 0;
    while( true ) {
      lVar8 = (long)local_1a4.smallend.vect[2];
      iVar10 = local_1a4.smallend.vect[2] + -1;
      if (uVar4 == uVar14) break;
      for (; (int)lVar8 <= local_1a4.bigend.vect[2]; lVar8 = lVar8 + 1) {
        lVar13 = (long)local_150.p +
                 local_150.nstride * local_260 +
                 (lVar3 - local_150.begin.y) * local_150.jstride * 8 +
                 (lVar8 - local_150.begin.z) * local_150.kstride * 8 + (long)local_150.begin.x * -8
                 + lVar5;
        lVar12 = local_210.jstride * 8;
        lVar11 = (lVar3 - local_210.begin.y) * lVar12;
        lVar7 = (long)local_210.p +
                (long)(iVar10 - local_210.begin.z) * local_210.kstride * 8 + lVar11 +
                local_210.nstride * local_260 + (long)local_210.begin.x * -8 + lVar5;
        lVar6 = (long)local_210.p +
                (lVar8 - local_210.begin.z) * local_210.kstride * 8 + lVar11 +
                local_210.nstride * local_260 + (long)local_210.begin.x * -8 + lVar5;
        for (lVar11 = lVar3; lVar11 <= local_1a4.bigend.vect[1]; lVar11 = lVar11 + 1) {
          if (local_1a4.smallend.vect[0] <= local_1a4.bigend.vect[0]) {
            lVar9 = 0;
            do {
              *(double *)(lVar13 + lVar9 * 8) =
                   (*(double *)(lVar6 + lVar9 * 8) - *(double *)(lVar7 + lVar9 * 8)) * local_1d0;
              lVar9 = lVar9 + 1;
            } while ((local_1a4.bigend.vect[0] - local_1a4.smallend.vect[0]) + 1 != (int)lVar9);
          }
          lVar13 = lVar13 + local_150.jstride * 8;
          lVar7 = lVar7 + lVar12;
          lVar6 = lVar6 + lVar12;
        }
        iVar10 = iVar10 + 1;
      }
      uVar4 = uVar4 + 1;
      local_260 = local_260 + 8;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MLCellLinOp::compGrad (int amrlev, const Array<MultiFab*,AMREX_SPACEDIM>& grad,
                       MultiFab& sol, Location /*loc*/) const
{
    BL_PROFILE("MLCellLinOp::compGrad()");

    if (sol.nComp() > 1)
      amrex::Abort("MLCellLinOp::compGrad called, but only works for single-component solves");

    const int mglev = 0;
    applyBC(amrlev, mglev, sol, BCMode::Inhomogeneous, StateMode::Solution,
            m_bndry_sol[amrlev].get());

    const int ncomp = getNComp();

    AMREX_D_TERM(const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);,
                 const Real dyi = m_geom[amrlev][mglev].InvCellSize(1);,
                 const Real dzi = m_geom[amrlev][mglev].InvCellSize(2););
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(sol, TilingIfNotGPU());  mfi.isValid(); ++mfi)
    {
        AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                     const Box& ybx = mfi.nodaltilebox(1);,
                     const Box& zbx = mfi.nodaltilebox(2););
        const auto& s = sol.array(mfi);
        AMREX_D_TERM(const auto& gx = grad[0]->array(mfi);,
                     const auto& gy = grad[1]->array(mfi);,
                     const auto& gz = grad[2]->array(mfi););

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( xbx, ncomp, i, j, k, n,
        {
            gx(i,j,k,n) = dxi*(s(i,j,k,n) - s(i-1,j,k,n));
        });
#if (AMREX_SPACEDIM >= 2)
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( ybx, ncomp, i, j, k, n,
        {
            gy(i,j,k,n) = dyi*(s(i,j,k,n) - s(i,j-1,k,n));
        });
#endif
#if (AMREX_SPACEDIM == 3)
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( zbx, ncomp, i, j, k, n,
        {
            gz(i,j,k,n) = dzi*(s(i,j,k,n) - s(i,j,k-1,n));
        });
#endif
    }
}